

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O1

int stbtt_FindGlyphIndex(stbtt_fontinfo *info,int unicode_codepoint)

{
  uchar *puVar1;
  long lVar2;
  bool bVar3;
  ushort uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  ushort uVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  ushort uVar12;
  int iVar13;
  uint uVar14;
  
  puVar1 = info->data;
  uVar5 = info->index_map;
  uVar7 = (ulong)uVar5;
  uVar4 = *(ushort *)(puVar1 + uVar7) << 8;
  uVar12 = *(ushort *)(puVar1 + uVar7) >> 8;
  uVar8 = uVar4 | uVar12;
  uVar6 = 0;
  uVar14 = 0;
  switch(uVar8) {
  case 0:
    uVar14 = uVar6;
    if (unicode_codepoint <
        (int)((ushort)(*(ushort *)(puVar1 + uVar7 + 2) << 8 | *(ushort *)(puVar1 + uVar7 + 2) >> 8)
             - 6)) {
      uVar14 = (uint)puVar1[(long)unicode_codepoint + uVar7 + 6];
    }
    break;
  default:
    uVar14 = uVar6;
    if ((uVar4 | uVar12 & 0xfffe) == 0xc) {
      uVar5 = *(uint *)(puVar1 + uVar7 + 0xc);
      uVar5 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
      iVar10 = 0;
      uVar14 = 0;
      do {
        if (uVar5 - iVar10 == 0 || (int)uVar5 < iVar10) {
          return 0;
        }
        uVar9 = ((int)(uVar5 - iVar10) >> 1) + iVar10;
        lVar2 = (long)(int)uVar9 * 0xc;
        uVar6 = *(uint *)(puVar1 + lVar2 + uVar7 + 0x10);
        uVar6 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
        bVar3 = true;
        iVar13 = unicode_codepoint - uVar6;
        if (uVar6 <= (uint)unicode_codepoint) {
          uVar6 = *(uint *)(puVar1 + lVar2 + uVar7 + 0x14);
          if ((uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18) <
              (uint)unicode_codepoint) {
            iVar10 = uVar9 + 1;
            uVar9 = uVar5;
          }
          else {
            bVar3 = false;
            uVar14 = *(uint *)(puVar1 + lVar2 + uVar7 + 0x18);
            if (uVar8 != 0xc) {
              iVar13 = 0;
            }
            uVar14 = iVar13 + (uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 |
                              uVar14 << 0x18);
            uVar9 = uVar5;
          }
        }
        uVar5 = uVar9;
      } while (bVar3);
    }
    break;
  case 2:
    break;
  case 4:
    uVar14 = uVar6;
    if (unicode_codepoint < 0x10000) {
      uVar4 = *(ushort *)(puVar1 + uVar7 + 6) << 8 | *(ushort *)(puVar1 + uVar7 + 6) >> 8;
      uVar12 = *(ushort *)(puVar1 + uVar7 + 10) << 8 | *(ushort *)(puVar1 + uVar7 + 10) >> 8;
      uVar11 = (ulong)(puVar1[uVar7 + 0xd] & 0xfffffffe) | (ulong)puVar1[uVar7 + 0xc] << 8;
      if (unicode_codepoint <
          (int)(uint)(ushort)(*(ushort *)(puVar1 + uVar11 + (uVar5 + 0xe)) << 8 |
                             *(ushort *)(puVar1 + uVar11 + (uVar5 + 0xe)) >> 8)) {
        uVar11 = 0;
      }
      uVar14 = uVar5 + (int)uVar11 + 0xc;
      if (uVar12 != 0) {
        uVar6 = (uint)(ushort)(*(ushort *)(puVar1 + uVar7 + 8) << 8 |
                              *(ushort *)(puVar1 + uVar7 + 8) >> 8);
        do {
          uVar6 = uVar6 >> 1;
          uVar9 = uVar6 & 0xfffffffe;
          if (unicode_codepoint <=
              (int)(uint)(ushort)(*(ushort *)(puVar1 + (ulong)uVar9 + (ulong)uVar14) << 8 |
                                 *(ushort *)(puVar1 + (ulong)uVar9 + (ulong)uVar14) >> 8)) {
            uVar9 = 0;
          }
          uVar14 = uVar9 + uVar14;
          uVar12 = uVar12 - 1;
        } while (uVar12 != 0);
      }
      uVar11 = (ulong)((uVar14 - uVar5) + 0x1fff4 & 0x1fffe);
      uVar6 = (uint)(ushort)(*(ushort *)(puVar1 + uVar11 + (uVar4 & 0xfffffffe) + uVar7 + 0x10) << 8
                            | *(ushort *)(puVar1 + uVar11 + (uVar4 & 0xfffffffe) + uVar7 + 0x10) >>
                              8);
      uVar14 = 0;
      if (((int)uVar6 <= unicode_codepoint) &&
         (uVar14 = 0,
         unicode_codepoint <=
         (int)(uint)(ushort)(*(ushort *)(puVar1 + uVar11 + (uVar5 + 0xe)) << 8 |
                            *(ushort *)(puVar1 + uVar11 + (uVar5 + 0xe)) >> 8))) {
        uVar4 = uVar4 >> 1;
        lVar2 = (ulong)((uint)uVar4 + (uint)uVar4) * 3;
        uVar12 = *(ushort *)(puVar1 + uVar11 + 2 + lVar2 + uVar7 + 0xe) << 8 |
                 *(ushort *)(puVar1 + uVar11 + 2 + lVar2 + uVar7 + 0xe) >> 8;
        if (uVar12 == 0) {
          uVar14 = (uint)(ushort)(*(ushort *)(puVar1 + uVar11 + 2 + (ulong)uVar4 * 4 + uVar7 + 0xe)
                                  << 8 | *(ushort *)
                                          (puVar1 + uVar11 + 2 + (ulong)uVar4 * 4 + uVar7 + 0xe) >>
                                         8) + unicode_codepoint;
        }
        else {
          uVar14 = (uint)(ushort)(*(ushort *)
                                   (puVar1 + uVar11 + 0x10 +
                                             (long)(int)((unicode_codepoint - uVar6) * 2) +
                                             lVar2 + uVar7 + uVar12) << 8 |
                                 *(ushort *)
                                  (puVar1 + uVar11 + 0x10 +
                                            (long)(int)((unicode_codepoint - uVar6) * 2) +
                                            lVar2 + uVar7 + uVar12) >> 8);
        }
      }
      uVar14 = uVar14 & 0xffff;
    }
    break;
  case 6:
    uVar4 = *(ushort *)(puVar1 + uVar7 + 6) << 8 | *(ushort *)(puVar1 + uVar7 + 6) >> 8;
    uVar14 = uVar6;
    if (((uint)uVar4 <= (uint)unicode_codepoint) &&
       ((uint)unicode_codepoint <
        (uint)(ushort)(*(ushort *)(puVar1 + uVar7 + 8) << 8 | *(ushort *)(puVar1 + uVar7 + 8) >> 8)
        + (uint)uVar4)) {
      uVar14 = (uint)(ushort)(*(ushort *)
                               (puVar1 + (ulong)((unicode_codepoint - (uint)uVar4) * 2) + uVar7 + 10
                               ) << 8 |
                             *(ushort *)
                              (puVar1 + (ulong)((unicode_codepoint - (uint)uVar4) * 2) + uVar7 + 10)
                             >> 8);
    }
  }
  return uVar14;
}

Assistant:

STBTT_DEF int stbtt_FindGlyphIndex(const stbtt_fontinfo *info, int unicode_codepoint)
{
   stbtt_uint8 *data = info->data;
   stbtt_uint32 index_map = info->index_map;

   stbtt_uint16 format = ttUSHORT(data + index_map + 0);
   if (format == 0) { // apple byte encoding
      stbtt_int32 bytes = ttUSHORT(data + index_map + 2);
      if (unicode_codepoint < bytes-6)
         return ttBYTE(data + index_map + 6 + unicode_codepoint);
      return 0;
   } else if (format == 6) {
      stbtt_uint32 first = ttUSHORT(data + index_map + 6);
      stbtt_uint32 count = ttUSHORT(data + index_map + 8);
      if ((stbtt_uint32) unicode_codepoint >= first && (stbtt_uint32) unicode_codepoint < first+count)
         return ttUSHORT(data + index_map + 10 + (unicode_codepoint - first)*2);
      return 0;
   } else if (format == 2) {
      STBTT_assert(0); // @TODO: high-byte mapping for japanese/chinese/korean
      return 0;
   } else if (format == 4) { // standard mapping for windows fonts: binary search collection of ranges
      stbtt_uint16 segcount = ttUSHORT(data+index_map+6) >> 1;
      stbtt_uint16 searchRange = ttUSHORT(data+index_map+8) >> 1;
      stbtt_uint16 entrySelector = ttUSHORT(data+index_map+10);
      stbtt_uint16 rangeShift = ttUSHORT(data+index_map+12) >> 1;

      // do a binary search of the segments
      stbtt_uint32 endCount = index_map + 14;
      stbtt_uint32 search = endCount;

      if (unicode_codepoint > 0xffff)
         return 0;

      // they lie from endCount .. endCount + segCount
      // but searchRange is the nearest power of two, so...
      if (unicode_codepoint >= ttUSHORT(data + search + rangeShift*2))
         search += rangeShift*2;

      // now decrement to bias correctly to find smallest
      search -= 2;
      while (entrySelector) {
         stbtt_uint16 end;
         searchRange >>= 1;
         end = ttUSHORT(data + search + searchRange*2);
         if (unicode_codepoint > end)
            search += searchRange*2;
         --entrySelector;
      }
      search += 2;

      {
         stbtt_uint16 offset, start, last;
         stbtt_uint16 item = (stbtt_uint16) ((search - endCount) >> 1);

         start = ttUSHORT(data + index_map + 14 + segcount*2 + 2 + 2*item);
         last = ttUSHORT(data + endCount + 2*item);
         if (unicode_codepoint < start || unicode_codepoint > last)
            return 0;

         offset = ttUSHORT(data + index_map + 14 + segcount*6 + 2 + 2*item);
         if (offset == 0)
            return (stbtt_uint16) (unicode_codepoint + ttSHORT(data + index_map + 14 + segcount*4 + 2 + 2*item));

         return ttUSHORT(data + offset + (unicode_codepoint-start)*2 + index_map + 14 + segcount*6 + 2 + 2*item);
      }
   } else if (format == 12 || format == 13) {
      stbtt_uint32 ngroups = ttULONG(data+index_map+12);
      stbtt_int32 low,high;
      low = 0; high = (stbtt_int32)ngroups;
      // Binary search the right group.
      while (low < high) {
         stbtt_int32 mid = low + ((high-low) >> 1); // rounds down, so low <= mid < high
         stbtt_uint32 start_char = ttULONG(data+index_map+16+mid*12);
         stbtt_uint32 end_char = ttULONG(data+index_map+16+mid*12+4);
         if ((stbtt_uint32) unicode_codepoint < start_char)
            high = mid;
         else if ((stbtt_uint32) unicode_codepoint > end_char)
            low = mid+1;
         else {
            stbtt_uint32 start_glyph = ttULONG(data+index_map+16+mid*12+8);
            if (format == 12)
               return start_glyph + unicode_codepoint-start_char;
            else // format == 13
               return start_glyph;
         }
      }
      return 0; // not found
   }
   // @TODO
   STBTT_assert(0);
   return 0;
}